

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

ssize_t __thiscall
booster::locale::basic_message<char>::write
          (basic_message<char> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  char *pcVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  ostream *poVar4;
  string_type buffer;
  locale alStack_38 [8];
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  poVar4 = (ostream *)CONCAT44(in_register_00000034,__fd);
  std::locale::locale(alStack_38,(locale *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0xd0));
  booster::locale::ios_info::get((ios_base *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18)));
  uVar1 = booster::locale::ios_info::domain_id();
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  pcVar2 = (char *)write(this,(int)alStack_38,(void *)(ulong)uVar1,(size_t)&local_30);
  std::operator<<(poVar4,pcVar2);
  std::__cxx11::string::~string((string *)&local_30);
  sVar3 = std::locale::~locale(alStack_38);
  return sVar3;
}

Assistant:

void write(std::basic_ostream<char_type> &out) const
            {
                std::locale const &loc = out.getloc();
                int id = ios_info::get(out).domain_id();
                string_type buffer;
                out << write(loc,id,buffer);
            }